

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

void __thiscall xe::TestRoot::TestRoot(TestRoot *this)

{
  _Rb_tree_header *p_Var1;
  
  TestNode::TestNode((TestNode *)this,(TestGroup *)0x0,TESTNODETYPE_ROOT,"","");
  (this->super_TestGroup).m_children.
  super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestGroup).m_children.
  super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestGroup).m_children.
  super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->super_TestGroup).m_childNames._M_t._M_impl.super__Rb_tree_header;
  (this->super_TestGroup).m_childNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_TestGroup).m_childNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_TestGroup).m_childNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_TestGroup).m_childNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_TestGroup).m_childNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_TestGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestGroup_0014f978;
  return;
}

Assistant:

TestRoot::TestRoot (void)
	: TestGroup(DE_NULL, TESTNODETYPE_ROOT, "", "")
{
}